

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_make_path_table_2(archive_write *a,vdd *vdd,int depth,int *dir_number)

{
  int iVar1;
  void *__base;
  long *plVar2;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  archive *in_RDI;
  int i;
  path_table *pt;
  isoent **enttbl;
  isoent *np;
  int local_44;
  long *local_38;
  long local_30;
  
  plVar2 = (long *)(*(long *)(in_RSI + 0x10) + (long)in_EDX * 0x20);
  if ((int)plVar2[3] == 0) {
    plVar2[2] = 0;
    return 0;
  }
  local_38 = (long *)malloc((long)(int)plVar2[3] << 3);
  if (local_38 == (long *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    return -0x1e;
  }
  plVar2[2] = (long)local_38;
  for (local_30 = *plVar2; local_30 != 0; local_30 = *(long *)(local_30 + 0x80)) {
    *local_38 = local_30;
    local_38 = local_38 + 1;
  }
  __base = (void *)plVar2[2];
  iVar1 = *(int *)(in_RSI + 8);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      qsort(__base,(long)(int)plVar2[3],8,_compare_path_table_joliet);
      goto LAB_0017bb6c;
    }
    if (iVar1 != 2) goto LAB_0017bb6c;
  }
  qsort(__base,(long)(int)plVar2[3],8,_compare_path_table);
LAB_0017bb6c:
  for (local_44 = 0; local_44 < (int)plVar2[3]; local_44 = local_44 + 1) {
    iVar1 = *in_RCX;
    *in_RCX = iVar1 + 1;
    *(int *)(*(long *)((long)__base + (long)local_44 * 8) + 0x88) = iVar1;
  }
  return 0;
}

Assistant:

static int
isoent_make_path_table_2(struct archive_write *a, struct vdd *vdd,
    int depth, int *dir_number)
{
	struct isoent *np;
	struct isoent **enttbl;
	struct path_table *pt;
	int i;

	pt = &vdd->pathtbl[depth];
	if (pt->cnt == 0) {
		pt->sorted = NULL;
		return (ARCHIVE_OK);
	}
	enttbl = malloc(pt->cnt * sizeof(struct isoent *));
	if (enttbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	pt->sorted = enttbl;
	for (np = pt->first; np != NULL; np = np->ptnext)
		*enttbl ++ = np;
	enttbl = pt->sorted;

	switch (vdd->vdd_type) {
	case VDD_PRIMARY:
	case VDD_ENHANCED:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table);
#endif
		break;
	case VDD_JOLIET:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table_joliet);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table_joliet);
#endif
		break;
	}
	for (i = 0; i < pt->cnt; i++)
		enttbl[i]->dir_number = (*dir_number)++;

	return (ARCHIVE_OK);
}